

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Iterator * __thiscall leveldb::DBImpl::NewIterator(DBImpl *this,ReadOptions *options)

{
  Iterator *pIVar1;
  Comparator *user_key_comparator;
  SequenceNumber local_50;
  Iterator *iter;
  SequenceNumber SStack_20;
  uint32_t seed;
  SequenceNumber latest_snapshot;
  ReadOptions *options_local;
  DBImpl *this_local;
  
  latest_snapshot = (SequenceNumber)options;
  options_local = (ReadOptions *)this;
  pIVar1 = NewInternalIterator(this,options,&stack0xffffffffffffffe0,(uint32_t *)((long)&iter + 4));
  user_key_comparator = user_comparator(this);
  if (*(long *)(latest_snapshot + 8) == 0) {
    local_50 = SStack_20;
  }
  else {
    local_50 = SnapshotImpl::sequence_number(*(SnapshotImpl **)(latest_snapshot + 8));
  }
  pIVar1 = NewDBIterator(this,user_key_comparator,pIVar1,local_50,iter._4_4_);
  return pIVar1;
}

Assistant:

Iterator* DBImpl::NewIterator(const ReadOptions& options) {
  SequenceNumber latest_snapshot;
  uint32_t seed;
  Iterator* iter = NewInternalIterator(options, &latest_snapshot, &seed);
  return NewDBIterator(this, user_comparator(), iter,
                       (options.snapshot != nullptr
                            ? static_cast<const SnapshotImpl*>(options.snapshot)
                                  ->sequence_number()
                            : latest_snapshot),
                       seed);
}